

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void bcemit_store(FuncState *fs,ExpDesc *var,ExpDesc *e)

{
  uint8_t *puVar1;
  ExpKind EVar2;
  BCReg BVar3;
  BCReg BVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  EVar2 = var->k;
  if (EVar2 == VGLOBAL) {
    BVar4 = expr_toanyreg(fs,e);
    BVar3 = const_gc(fs,(GCobj *)(var->u).sval,0xfffffffb);
    uVar6 = BVar3 << 0x10 | BVar4 << 8 | 0x35;
  }
  else if (EVar2 == VUPVAL) {
    puVar1 = &fs->ls->vstack[(var->u).s.aux].info;
    *puVar1 = *puVar1 | 1;
    expr_toval(fs,e);
    EVar2 = e->k;
    uVar6 = (var->u).s.info << 8;
    if (EVar2 < VKSTR) {
      uVar6 = EVar2 << 0x10 | uVar6 | 0x2f;
    }
    else if (EVar2 == VKLAST) {
      BVar4 = const_num(fs,e);
      uVar6 = uVar6 | BVar4 << 0x10 | 0x2e;
    }
    else if (EVar2 == VKSTR) {
      BVar4 = const_gc(fs,(GCobj *)(e->u).sval,0xfffffffb);
      uVar6 = uVar6 | BVar4 << 0x10 | 0x2d;
    }
    else {
      BVar4 = expr_toanyreg(fs,e);
      uVar6 = uVar6 | BVar4 << 0x10 | 0x2c;
    }
  }
  else {
    if (EVar2 == VLOCAL) {
      puVar1 = &fs->ls->vstack[(var->u).s.aux].info;
      *puVar1 = *puVar1 | 1;
      if ((e->k == VNONRELOC) && (fs->nactvar <= (e->u).s.info)) {
        fs->freereg = fs->freereg - 1;
      }
      expr_toreg(fs,e,(var->u).s.info);
      return;
    }
    BVar4 = expr_toanyreg(fs,e);
    uVar6 = (var->u).s.aux;
    uVar5 = BVar4 << 8;
    if ((int)uVar6 < 0) {
      uVar6 = ~uVar6 << 0x10 | (var->u).s.info << 0x18 | uVar5 | 0x3a;
    }
    else {
      uVar7 = (var->u).s.info << 0x18;
      if (uVar6 < 0x100) {
        uVar6 = uVar5 | uVar6 * 0x10000 | uVar7 | 0x39;
      }
      else {
        uVar6 = uVar5 | uVar7 | uVar6 * 0x10000 - 0x1000000 | 0x3b;
      }
    }
  }
  bcemit_INS(fs,uVar6);
  if ((e->k == VNONRELOC) && (fs->nactvar <= (e->u).s.info)) {
    fs->freereg = fs->freereg - 1;
  }
  return;
}

Assistant:

static void bcemit_store(FuncState *fs, ExpDesc *var, ExpDesc *e)
{
  BCIns ins;
  if (var->k == VLOCAL) {
    fs->ls->vstack[var->u.s.aux].info |= VSTACK_VAR_RW;
    expr_free(fs, e);
    expr_toreg(fs, e, var->u.s.info);
    return;
  } else if (var->k == VUPVAL) {
    fs->ls->vstack[var->u.s.aux].info |= VSTACK_VAR_RW;
    expr_toval(fs, e);
    if (e->k <= VKTRUE)
      ins = BCINS_AD(BC_USETP, var->u.s.info, const_pri(e));
    else if (e->k == VKSTR)
      ins = BCINS_AD(BC_USETS, var->u.s.info, const_str(fs, e));
    else if (e->k == VKNUM)
      ins = BCINS_AD(BC_USETN, var->u.s.info, const_num(fs, e));
    else
      ins = BCINS_AD(BC_USETV, var->u.s.info, expr_toanyreg(fs, e));
  } else if (var->k == VGLOBAL) {
    BCReg ra = expr_toanyreg(fs, e);
    ins = BCINS_AD(BC_GSET, ra, const_str(fs, var));
  } else {
    BCReg ra, rc;
    lua_assert(var->k == VINDEXED);
    ra = expr_toanyreg(fs, e);
    rc = var->u.s.aux;
    if ((int32_t)rc < 0) {
      ins = BCINS_ABC(BC_TSETS, ra, var->u.s.info, ~rc);
    } else if (rc > BCMAX_C) {
      ins = BCINS_ABC(BC_TSETB, ra, var->u.s.info, rc-(BCMAX_C+1));
    } else {
      /* Free late alloced key reg to avoid assert on free of value reg. */
      /* This can only happen when called from expr_table(). */
      lua_assert(e->k != VNONRELOC || ra < fs->nactvar ||
		 rc < ra || (bcreg_free(fs, rc),1));
      ins = BCINS_ABC(BC_TSETV, ra, var->u.s.info, rc);
    }
  }
  bcemit_INS(fs, ins);
  expr_free(fs, e);
}